

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorPicker::mouseMoveEvent(QColorPicker *this,QMouseEvent *m)

{
  long lVar1;
  bool bVar2;
  QFlagsStorage<Qt::MouseButton> lhs;
  QColorPicker *in_RSI;
  QSinglePointEvent *in_RDI;
  long in_FS_OFFSET;
  QPoint p;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSinglePointEvent::position((QSinglePointEvent *)0x7336e0);
  QPointF::toPoint((QPointF *)in_RSI);
  QWidget::contentsRect((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  ::operator-((QPoint *)in_RSI,
              (QPoint *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  lhs.i = (Int)QSinglePointEvent::buttons(in_RDI);
  bVar2 = ::operator==((QFlags<Qt::MouseButton>)lhs.i,(MouseButton)in_RDI);
  if (bVar2) {
    QEvent::ignore((QEvent *)in_RSI);
  }
  else {
    setCol(in_RSI,(QPoint *)CONCAT44(lhs.i,in_stack_ffffffffffffffa8));
    newCol((QColorPicker *)0x73377c,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorPicker::mouseMoveEvent(QMouseEvent *m)
{
    QPoint p = m->position().toPoint() - contentsRect().topLeft();
    if (m->buttons() == Qt::NoButton) {
        m->ignore();
        return;
    }
    setCol(p);
    emit newCol(hue, sat);
}